

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

ggml_cgraph * clip_image_build_graph_pixtral(clip_ctx *ctx,clip_image_f32_batch *imgs)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_type sVar12;
  pointer pcVar13;
  uchar *puVar14;
  ggml_tensor *pgVar15;
  ggml_cgraph *pgVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  const_reference pvVar19;
  ggml_tensor *pgVar20;
  undefined8 uVar21;
  ggml_context *pgVar22;
  undefined4 *puVar23;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *in_RSI;
  long in_RDI;
  float fVar24;
  ggml_tensor *tok;
  ggml_tensor *cur_1;
  int n_tokens_output;
  int n_embd_text;
  ggml_tensor *up_proj;
  ggml_tensor *gate_proj;
  ggml_tensor *KQV;
  ggml_tensor *KQ;
  ggml_tensor *V;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *cur;
  int il;
  ggml_tensor *embeddings;
  ggml_tensor *inp;
  ggml_tensor *pos_w;
  ggml_tensor *pos_h;
  ggml_tensor *inp_raw;
  ggml_cgraph *gf;
  pointer ctx0;
  ggml_context_ptr ctx0_ptr;
  ggml_init_params params;
  float eps;
  int n_layer;
  int d_head;
  int n_head;
  int hidden_size;
  int num_patches;
  int n_patches_y;
  int n_patches_x;
  int patch_size;
  int image_size_height;
  int image_size_width;
  clip_hparams *hparams;
  clip_vision_model *model;
  undefined4 uVar25;
  unique_ptr<ggml_context,_ggml_context_deleter> *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffd00;
  ggml_tensor *in_stack_fffffffffffffd08;
  ggml_tensor *in_stack_fffffffffffffd10;
  ggml_tensor *in_stack_fffffffffffffd18;
  ggml_context *in_stack_fffffffffffffd20;
  int local_d4;
  undefined8 local_d0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined7 uStack_57;
  
  if (*(int *)(in_RDI + 0x300) != 9) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x274,"GGML_ASSERT(%s) failed","ctx->proj_type == PROJECTOR_TYPE_PIXTRAL");
  }
  sVar12 = std::
           vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
           ::size(in_RSI);
  if (sVar12 != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x275,"GGML_ASSERT(%s) failed","imgs.entries.size() == 1");
  }
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::operator[](in_RSI,0);
  pcVar13 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                      ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1c2a62);
  iVar2 = pcVar13->nx;
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::operator[](in_RSI,0);
  pcVar13 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                      ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1c2a88);
  iVar3 = pcVar13->ny;
  iVar4 = *(int *)(in_RDI + 0x14);
  iVar8 = iVar2 / iVar4;
  iVar9 = iVar3 / iVar4;
  iVar10 = iVar8 * iVar9;
  iVar5 = *(int *)(in_RDI + 0x18);
  iVar6 = *(int *)(in_RDI + 0x24);
  iVar11 = iVar5 / iVar6;
  iVar7 = *(int *)(in_RDI + 0x28);
  uVar1 = *(undefined4 *)(in_RDI + 0x34);
  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x338));
  puVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c2b80);
  uVar25 = (undefined4)((uint7)uStack_57 >> 0x18);
  local_88 = (undefined4)sVar12;
  uStack_84 = (undefined4)(sVar12 >> 0x20);
  uStack_80 = SUB84(puVar14,0);
  uStack_7c = (undefined4)((ulong)puVar14 >> 0x20);
  ggml_init();
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uStack_7c,uStack_80),
             (pointer)CONCAT44(uStack_84,local_88));
  pgVar15 = (ggml_tensor *)
            std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)
                       CONCAT44(uStack_7c,uStack_80));
  pgVar16 = (ggml_cgraph *)ggml_new_graph(pgVar15);
  uVar17 = ggml_new_tensor_3d(pgVar15,0,(long)iVar2,(long)iVar3,3);
  ggml_set_name(uVar17,"inp_raw");
  ggml_set_input(uVar17);
  uVar18 = ggml_new_tensor_1d(pgVar15,0x1a,(long)iVar10);
  ggml_set_name(uVar18,"pos_h");
  ggml_set_input(uVar18);
  uVar18 = ggml_new_tensor_1d(pgVar15,0x1a,(long)iVar10);
  ggml_set_name(uVar18,"pos_w");
  ggml_set_input(uVar18);
  uVar17 = ggml_conv_2d(pgVar15,*(undefined8 *)(in_RDI + 0xa0),uVar17,iVar4,iVar4,0,0,1,
                        CONCAT44(uVar25,1));
  uVar17 = ggml_reshape_2d(pgVar15,uVar17,(long)iVar10,(long)iVar5);
  uVar17 = ggml_transpose(pgVar15,uVar17);
  uVar17 = ggml_cont(pgVar15,uVar17);
  uVar17 = ggml_rms_norm(uVar1,pgVar15,uVar17);
  local_d0 = ggml_mul(pgVar15,uVar17,*(undefined8 *)(in_RDI + 0xc0));
  for (local_d4 = 0; fVar24 = (float)((ulong)in_stack_fffffffffffffd00 >> 0x20), local_d4 < iVar7;
      local_d4 = local_d4 + 1) {
    uVar17 = ggml_rms_norm(uVar1,pgVar15,local_d0);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar17 = ggml_mul(pgVar15,uVar17,pvVar19->ln_1_w);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar18 = ggml_mul_mat(pgVar15,pvVar19->q_w,uVar17);
    ggml_reshape_3d(pgVar15,uVar18,(long)iVar11,(long)iVar6,(long)iVar10);
    pgVar20 = build_rope_2d(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                            in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,fVar24);
    uVar18 = ggml_permute(pgVar15,pgVar20,0,2,1,3);
    uVar18 = ggml_cont(pgVar15,uVar18);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar21 = ggml_mul_mat(pgVar15,pvVar19->k_w,uVar17);
    ggml_reshape_3d(pgVar15,uVar21,(long)iVar11,(long)iVar6,(long)iVar10);
    pgVar20 = build_rope_2d(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                            in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,fVar24);
    uVar21 = ggml_permute(pgVar15,pgVar20,0,2,1,3);
    uVar21 = ggml_cont(pgVar15,uVar21);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar17 = ggml_mul_mat(pgVar15,pvVar19->v_w,uVar17);
    uVar17 = ggml_reshape_3d(pgVar15,uVar17,(long)iVar11,(long)iVar6,(long)iVar10);
    uVar17 = ggml_permute(pgVar15,uVar17,1,2,0,3);
    uVar17 = ggml_cont(pgVar15,uVar17);
    uVar18 = ggml_mul_mat(pgVar15,uVar21,uVar18);
    fVar24 = sqrtf((float)iVar11);
    uVar18 = ggml_soft_max_ext(1.0 / fVar24,0,pgVar15,uVar18,0);
    uVar17 = ggml_mul_mat(pgVar15,uVar17,uVar18);
    uVar17 = ggml_reshape_3d(pgVar15,uVar17,(long)iVar11,(long)iVar10,(long)iVar6);
    uVar17 = ggml_permute(pgVar15,uVar17,0,2,1,3);
    uVar17 = ggml_cont_2d(pgVar15,uVar17,(long)iVar5,(long)iVar10);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar17 = ggml_mul_mat(pgVar15,pvVar19->o_w,uVar17);
    uVar17 = ggml_add(pgVar15,uVar17,local_d0);
    uVar18 = ggml_rms_norm(uVar1,pgVar15,uVar17);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar18 = ggml_mul(pgVar15,uVar18,pvVar19->ln_2_w);
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    uVar21 = ggml_mul_mat(pgVar15,pvVar19->ff_gate_w,uVar18);
    in_stack_fffffffffffffd18 = pgVar15;
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    pgVar22 = (ggml_context *)ggml_mul_mat(in_stack_fffffffffffffd18,pvVar19->ff_up_w,uVar18);
    in_stack_fffffffffffffd20 = pgVar22;
    in_stack_fffffffffffffd10 = (ggml_tensor *)ggml_silu(pgVar15,uVar21);
    pgVar20 = (ggml_tensor *)ggml_mul(pgVar15,pgVar22,in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd08 = pgVar20;
    pvVar19 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_d4);
    in_stack_fffffffffffffd00 = ggml_mul_mat(pgVar15,pvVar19->ff_down_w,pgVar20);
    local_d0 = ggml_add(pgVar15,uVar17,in_stack_fffffffffffffd00);
  }
  uVar17 = ggml_mul_mat(pgVar15,*(undefined8 *)(in_RDI + 0x128),local_d0);
  uVar17 = ggml_add(pgVar15,uVar17,*(undefined8 *)(in_RDI + 0x130));
  uVar17 = ggml_gelu(pgVar15,uVar17);
  uVar17 = ggml_mul_mat(pgVar15,*(undefined8 *)(in_RDI + 0x110),uVar17);
  puVar23 = (undefined4 *)ggml_add(pgVar15,uVar17,*(undefined8 *)(in_RDI + 0x118));
  iVar2 = puVar23[4];
  uVar17 = ggml_reshape_3d(pgVar15,puVar23,(long)iVar2,(long)iVar8,(long)iVar9);
  uVar18 = ggml_new_tensor_3d(pgVar15,*puVar23,(long)iVar2,1,(long)iVar9);
  uVar18 = ggml_scale(0,pgVar15,uVar18);
  uVar18 = ggml_add(pgVar15,uVar18,*(undefined8 *)(in_RDI + 0x2f8));
  puVar23 = (undefined4 *)ggml_concat(pgVar15,uVar17,uVar18,1);
  uVar17 = ggml_row_size(*puVar23);
  uVar17 = ggml_view_2d(pgVar15,puVar23,(long)iVar2,(long)(iVar10 + -1 + iVar9),uVar17,0);
  ggml_build_forward_expand(pgVar16,uVar17);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(in_stack_fffffffffffffc60);
  return pgVar16;
}

Assistant:

static ggml_cgraph * clip_image_build_graph_pixtral(clip_ctx * ctx, const clip_image_f32_batch & imgs) {
    const auto & model = ctx->vision_model;
    const auto & hparams = model.hparams;

    GGML_ASSERT(ctx->proj_type == PROJECTOR_TYPE_PIXTRAL);
    GGML_ASSERT(imgs.entries.size() == 1); // batch_size == 1

    int image_size_width  = imgs.entries[0]->nx;
    int image_size_height = imgs.entries[0]->ny;

    const int patch_size  = hparams.patch_size;
    const int n_patches_x = image_size_width  / patch_size;
    const int n_patches_y = image_size_height / patch_size;
    const int num_patches = n_patches_x * n_patches_y;
    const int hidden_size = hparams.hidden_size;
    const int n_head      = hparams.n_head;
    const int d_head      = hidden_size / n_head;
    const int n_layer     = hparams.n_layer;
    const float eps       = hparams.eps;

    struct ggml_init_params params = {
        /*.mem_size   =*/ ctx->buf_compute_meta.size(),
        /*.mem_buffer =*/ ctx->buf_compute_meta.data(),
        /*.no_alloc   =*/ true,
    };

    ggml_context_ptr ctx0_ptr(ggml_init(params));
    auto ctx0 = ctx0_ptr.get();

    struct ggml_cgraph * gf = ggml_new_graph(ctx0);

    // input raw
    struct ggml_tensor * inp_raw = ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, image_size_width, image_size_height, 3);
    ggml_set_name(inp_raw, "inp_raw");
    ggml_set_input(inp_raw);

    // 2D input positions
    struct ggml_tensor * pos_h = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, num_patches);
    ggml_set_name(pos_h, "pos_h");
    ggml_set_input(pos_h);
    struct ggml_tensor * pos_w = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, num_patches);
    ggml_set_name(pos_w, "pos_w");
    ggml_set_input(pos_w);

    struct ggml_tensor * inp = ggml_conv_2d(ctx0, model.patch_embeddings_0, inp_raw, patch_size, patch_size, 0, 0, 1, 1);
    inp = ggml_reshape_2d(ctx0, inp, num_patches, hidden_size);
    inp = ggml_cont(ctx0, ggml_transpose(ctx0, inp));

    struct ggml_tensor * embeddings = inp;

    // pre-layer norm
    embeddings = ggml_mul(ctx0, ggml_rms_norm(ctx0, embeddings, eps), model.pre_ln_w);

    // loop over layers
    for (int il = 0; il < n_layer; il++) {
        struct ggml_tensor * cur = embeddings;

        // pre-attention norm
        cur = ggml_mul(ctx0, ggml_rms_norm(ctx0, cur, eps), model.layers[il].ln_1_w);

        // self-attention
        {
            struct ggml_tensor * Q = ggml_mul_mat(ctx0, model.layers[il].q_w, cur);

            Q = ggml_reshape_3d(ctx0, Q, d_head, n_head, num_patches);
            Q = build_rope_2d(ctx0, Q, pos_h, pos_w, hparams.rope_theta);
            Q = ggml_cont(ctx0, ggml_permute(ctx0, Q, 0, 2, 1, 3));

            struct ggml_tensor * K = ggml_mul_mat(ctx0, model.layers[il].k_w, cur);

            K = ggml_reshape_3d(ctx0, K, d_head, n_head, num_patches);
            K = build_rope_2d(ctx0, K, pos_h, pos_w, hparams.rope_theta);
            K = ggml_cont(ctx0, ggml_permute(ctx0, K, 0, 2, 1, 3));

            struct ggml_tensor * V = ggml_mul_mat(ctx0, model.layers[il].v_w, cur);

            V = ggml_reshape_3d(ctx0, V, d_head, n_head, num_patches);
            V = ggml_cont(ctx0, ggml_permute(ctx0, V, 1, 2, 0, 3));

            struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);
            KQ = ggml_soft_max_ext(ctx0, KQ, nullptr, 1.0f / sqrtf((float)d_head), 0.0f);

            struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V, KQ);
            KQV = ggml_reshape_3d(ctx0, KQV, d_head, num_patches, n_head);
            KQV = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

            cur = ggml_cont_2d(ctx0, KQV, hidden_size, num_patches);

            cur = ggml_mul_mat(ctx0, model.layers[il].o_w, cur);
        }

        // re-add the layer input, e.g., residual
        cur = ggml_add(ctx0, cur, embeddings);

        embeddings = cur; // embeddings = residual, cur = hidden_states

        // pre-ffn norm
        cur = ggml_mul(ctx0, ggml_rms_norm(ctx0, cur, eps), model.layers[il].ln_2_w);

        // feed-forward
        {
            ggml_tensor * gate_proj = ggml_mul_mat(ctx0, model.layers[il].ff_gate_w, cur);
            ggml_tensor * up_proj   = ggml_mul_mat(ctx0, model.layers[il].ff_up_w,   cur);
            gate_proj = ggml_silu(ctx0, gate_proj); // pixtral uses silu
            cur = ggml_mul(ctx0, up_proj, gate_proj);
            cur = ggml_mul_mat(ctx0, model.layers[il].ff_down_w, cur);
        }

        // residual 2
        cur = ggml_add(ctx0, embeddings, cur);

        embeddings = cur;
    }

    // LlavaMultiModalProjector (with GELU activation)
    {
        embeddings = ggml_mul_mat(ctx0, model.mm_1_w, embeddings);
        embeddings = ggml_add(ctx0, embeddings, model.mm_1_b);

        embeddings = ggml_gelu(ctx0, embeddings);
        embeddings = ggml_mul_mat(ctx0, model.mm_2_w, embeddings);
        embeddings = ggml_add(ctx0, embeddings, model.mm_2_b);
    }

    // arrangement of the [IMG_BREAK] token
    {
        // not efficient, but works
        // the trick is to view the embeddings as a 3D tensor with shape [hidden_size, n_patches_per_row, n_rows]
        // and then concatenate the [IMG_BREAK] token to the end of each row, aka n_patches_per_row dimension
        // after the concatenation, we have a tensor with shape [hidden_size, n_patches_per_row + 1, n_rows]

        const int n_embd_text     = embeddings->ne[0];
        const int n_tokens_output = num_patches + n_patches_y - 1; // one [IMG_BREAK] per row, except the last row

        ggml_tensor * cur = ggml_reshape_3d(ctx0, embeddings, n_embd_text, n_patches_x, n_patches_y);
        ggml_tensor * tok = ggml_new_tensor_3d(ctx0, embeddings->type, n_embd_text, 1, n_patches_y);
        tok = ggml_scale(ctx0, tok, 0.0); // clear the tensor
        tok = ggml_add(ctx0, tok, model.token_embd_img_break);
        cur = ggml_concat(ctx0, cur, tok, 1);
        embeddings = ggml_view_2d(ctx0, cur,
            n_embd_text, n_tokens_output,
            ggml_row_size(cur->type, n_embd_text), 0);
    }

    // build the graph
    ggml_build_forward_expand(gf, embeddings);

    return gf;
}